

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QString>::emplace<QLatin1String>
          (QMovableArrayOps<QString> *this,qsizetype i,QLatin1String *args)

{
  QString **ppQVar1;
  QString *pQVar2;
  Data *pDVar3;
  long lVar4;
  storage_type *psVar5;
  char *pcVar6;
  Data *pDVar7;
  char16_t *pcVar8;
  qsizetype qVar9;
  storage_type *psVar10;
  QString *pQVar11;
  qsizetype *pqVar12;
  long in_FS_OFFSET;
  bool bVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  Data *local_50;
  char16_t *local_48;
  qsizetype local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_004d74a6:
    psVar5 = (storage_type *)args->m_size;
    pcVar6 = args->m_data;
    psVar10 = (storage_type *)0x0;
    if (0 < (long)psVar5) {
      psVar10 = psVar5;
    }
    if (pcVar6 == (char *)0x0) {
      psVar10 = (storage_type *)0x0;
    }
    if (pcVar6 != (char *)0x0 && (long)psVar5 < 0) {
      psVar10 = (storage_type *)strlen(pcVar6);
    }
    QVar14.m_data = psVar10;
    QVar14.m_size = (qsizetype)&local_50;
    QString::fromLatin1(QVar14);
    qVar9 = local_40;
    pcVar8 = local_48;
    pDVar7 = local_50;
    bVar13 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size != 0;
    QArrayDataPointer<QString>::detachAndGrow
              ((QArrayDataPointer<QString> *)this,(uint)(i == 0 && bVar13),1,(QString **)0x0,
               (QArrayDataPointer<QString> *)0x0);
    pQVar11 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr;
    if (i == 0 && bVar13) {
      pQVar11[-1].d.d = pDVar7;
      pQVar11[-1].d.ptr = pcVar8;
      pQVar11[-1].d.size = qVar9;
      (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr = pQVar11 + -1;
    }
    else {
      pQVar2 = pQVar11 + i;
      memmove(pQVar2 + 1,pQVar11 + i,
              ((this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size - i) *
              0x18);
      (pQVar2->d).d = pDVar7;
      (pQVar2->d).ptr = pcVar8;
      (pQVar2->d).size = qVar9;
    }
  }
  else {
    lVar4 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar4 !=
        ((long)((long)(this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        -0x5555555555555555)) {
      psVar5 = (storage_type *)args->m_size;
      pcVar6 = args->m_data;
      pQVar11 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr + lVar4
      ;
      psVar10 = (storage_type *)0x0;
      if (0 < (long)psVar5) {
        psVar10 = psVar5;
      }
      if (pcVar6 == (char *)0x0) {
        psVar10 = (storage_type *)0x0;
      }
      if (pcVar6 != (char *)0x0 && (long)psVar5 < 0) {
        psVar10 = (storage_type *)strlen(pcVar6);
      }
      QVar16.m_data = psVar10;
      QVar16.m_size = (qsizetype)&local_50;
      QString::fromLatin1(QVar16);
      (pQVar11->d).d = local_50;
      (pQVar11->d).ptr = local_48;
      (pQVar11->d).size = local_40;
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((QString *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr))
      goto LAB_004d74a6;
      pQVar11 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr;
      psVar5 = (storage_type *)args->m_size;
      pcVar6 = args->m_data;
      psVar10 = (storage_type *)0x0;
      if (0 < (long)psVar5) {
        psVar10 = psVar5;
      }
      if (pcVar6 == (char *)0x0) {
        psVar10 = (storage_type *)0x0;
      }
      if (pcVar6 != (char *)0x0 && (long)psVar5 < 0) {
        psVar10 = (storage_type *)strlen(pcVar6);
      }
      QVar15.m_data = psVar10;
      QVar15.m_size = (qsizetype)&local_50;
      QString::fromLatin1(QVar15);
      pQVar11[-1].d.d = local_50;
      pQVar11[-1].d.ptr = local_48;
      pQVar11[-1].d.size = local_40;
      ppQVar1 = &(this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    local_40 = 0;
    local_48 = (char16_t *)0x0;
    local_50 = (Data *)0x0;
  }
  pqVar12 = &(this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size;
  *pqVar12 = *pqVar12 + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }